

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_multi_init(CTState *cts,CType *d,TValue *o)

{
  CType *pCVar1;
  uint *in_RDX;
  CType *in_RSI;
  CTState *in_RDI;
  int local_4;
  
  if (((in_RSI->info & 0xfc000000) == 0x30000000) || (in_RSI->info >> 0x1c == 1)) {
    if ((in_RDX[1] == 0xfffffff4) || ((in_RDX[1] == 0xfffffffb && (in_RSI->info >> 0x1c != 1)))) {
      local_4 = 0;
    }
    else {
      if ((in_RDX[1] == 0xfffffff5) &&
         (pCVar1 = lj_ctype_rawref(in_RDI,(uint)*(ushort *)((ulong)*in_RDX + 6)), pCVar1 == in_RSI))
      {
        return 0;
      }
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int lj_cconv_multi_init(CTState *cts, CType *d, TValue *o)
{
  if (!(ctype_isrefarray(d->info) || ctype_isstruct(d->info)))
    return 0;  /* Destination is not an aggregate. */
  if (tvistab(o) || (tvisstr(o) && !ctype_isstruct(d->info)))
    return 0;  /* Initializer is not a value. */
  if (tviscdata(o) && lj_ctype_rawref(cts, cdataV(o)->ctypeid) == d)
    return 0;  /* Source and destination are identical aggregates. */
  return 1;  /* Otherwise the initializer is a value. */
}